

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::TypedArrayBase::GetItemSetter
          (TypedArrayBase *this,uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  if (index < (this->super_ArrayBufferParent).super_ArrayObject.length) {
    DVar1 = DynamicObject::GetItemSetter((DynamicObject *)this,index,setterValue,requestContext);
    return DVar1;
  }
  return None_NoProto;
}

Assistant:

DescriptorFlags TypedArrayBase::GetItemSetter(uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        if (index >= this->GetLength())
        {
            return None_NoProto;
        }

        return __super::GetItemSetter(index, setterValue, requestContext);
    }